

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Arguments::parse(Arguments *this,int argc,char **argv)

{
  bool bVar1;
  StringView local_68;
  StringView local_58;
  StringView local_48;
  StringView local_38;
  int local_24;
  char **ppcStack_20;
  int i;
  char **argv_local;
  Arguments *pAStack_10;
  int argc_local;
  Arguments *this_local;
  
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pAStack_10 = this;
  for (local_24 = 1; local_24 < argv_local._4_4_; local_24 = local_24 + 1) {
    StringView::StringView(&local_38,ppcStack_20[local_24]);
    StringView::StringView(&local_48,"-c");
    bVar1 = StringView::operator==(&local_38,&local_48);
    if (bVar1) {
      this->codegen = CodegenC::codegen;
    }
    else {
      StringView::StringView(&local_58,ppcStack_20[local_24]);
      StringView::StringView(&local_68,"-js");
      bVar1 = StringView::operator==(&local_58,&local_68);
      if (bVar1) {
        this->codegen = CodegenJS::codegen;
      }
      else {
        this->source_path = ppcStack_20[local_24];
      }
    }
  }
  return;
}

Assistant:

void parse(int argc, char** argv) {
		for (int i = 1; i < argc; ++i) {
			if (StringView(argv[i]) == "-c") codegen = CodegenC::codegen;
			else if (StringView(argv[i]) == "-js") codegen = CodegenJS::codegen;
			else source_path = argv[i];
		}
	}